

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int INT_CMinstall_pull_schedule
              (CManager_conflict cm,timeval *base_time,timeval *period,CMavail_period_ptr avail)

{
  long lVar1;
  long lVar2;
  long lVar3;
  transport_entry_conflict p_Var4;
  FILE *pFVar5;
  long lVar6;
  __suseconds_t _Var7;
  int iVar8;
  __pid_t _Var9;
  CMavail_period_ptr __dest;
  long lVar10;
  pthread_t pVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  char *__ptr;
  __suseconds_t *p_Var16;
  size_t __nmemb;
  transport_entry_conflict *pp_Var17;
  bool bVar18;
  bool bVar19;
  size_t sStack_50;
  timespec ts;
  
  sVar13 = 0;
  __nmemb = 0;
  do {
    lVar10 = *(long *)((long)&(avail->offset).tv_sec + sVar13);
    if (lVar10 == 0) {
      lVar10 = *(long *)((long)&(avail->offset).tv_usec + sVar13);
      if (lVar10 != 0) goto LAB_001204a7;
      if ((*(long *)((long)&(avail->duration).tv_sec + sVar13) == 0) &&
         (*(long *)((long)&(avail->duration).tv_usec + sVar13) == 0)) {
        __dest = (CMavail_period_ptr)INT_CMmalloc(sVar13 + 0x20 & 0x1fffffffe0);
        memcpy(__dest,avail,sVar13);
        qsort(__dest,__nmemb,0x20,offset_compare);
        p_Var16 = &(avail->duration).tv_usec;
        sVar13 = 0;
        lVar10 = 0;
        lVar12 = 0;
        break;
      }
    }
    else {
      if (lVar10 < 0) {
        __ptr = "CMinstall_pull_schedule(), avail sec offset is negative.  Rejected\n";
        sStack_50 = 0x43;
        goto LAB_00120626;
      }
      lVar10 = *(long *)((long)&(avail->offset).tv_usec + sVar13);
LAB_001204a7:
      if (lVar10 < 0) {
        __ptr = "CMinstall_pull_schedule(), avail usec offset is negative.  Rejected\n";
        sStack_50 = 0x44;
        goto LAB_00120626;
      }
    }
    if (*(long *)((long)&(avail->duration).tv_sec + sVar13) < 0) {
      __ptr = "CMinstall_pull_schedule(), avail sec duration is negative.  Rejected\n";
      sStack_50 = 0x45;
      goto LAB_00120626;
    }
    if (*(long *)((long)&(avail->duration).tv_usec + sVar13) < 0) {
      __ptr = "CMinstall_pull_schedule(), avail usec duration is negative.  Rejected\n";
      sStack_50 = 0x46;
LAB_00120626:
      fwrite(__ptr,sStack_50,1,_stderr);
      return 0;
    }
    __nmemb = __nmemb + 1;
    sVar13 = sVar13 + 0x20;
  } while( true );
LAB_00120527:
  if (__nmemb == sVar13) {
    _Var7 = base_time->tv_usec;
    (cm->base_time).tv_sec = base_time->tv_sec;
    (cm->base_time).tv_usec = _Var7;
    _Var7 = period->tv_usec;
    (cm->period).tv_sec = period->tv_sec;
    (cm->period).tv_usec = _Var7;
    cm->avail = __dest;
    pp_Var17 = cm->transports;
    iVar8 = CMtrace_val[5];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar8 = CMtrace_init(cm,CMTransportVerbose);
    }
    if (iVar8 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)cm->CMTrace_file;
        _Var9 = getpid();
        pVar11 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var9,pVar11);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "CM installed pull schedule with period %ld secs, %zd usecs\n",period->tv_sec,
              period->tv_usec);
    }
    fflush((FILE *)cm->CMTrace_file);
    while( true ) {
      if (pp_Var17 == (transport_entry_conflict *)0x0) {
        return 0;
      }
      p_Var4 = *pp_Var17;
      if (p_Var4 == (transport_entry_conflict)0x0) break;
      if (p_Var4->install_pull_schedule_func != (CMTransport_install_pull_schedule)0x0) {
        (*p_Var4->install_pull_schedule_func)
                  (&CMstatic_trans_svcs,p_Var4,base_time,period,cm->avail);
        iVar8 = CMtrace_val[5];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar8 = CMtrace_init(cm,CMTransportVerbose);
        }
        if (iVar8 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = (FILE *)cm->CMTrace_file;
            _Var9 = getpid();
            pVar11 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var9,pVar11);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"CM installed pull schedule to transport %s\n",
                  (*pp_Var17)->trans_name);
        }
        fflush((FILE *)cm->CMTrace_file);
      }
      pp_Var17 = pp_Var17 + 1;
    }
    return 0;
  }
  lVar2 = p_Var16[-3];
  lVar3 = p_Var16[-2];
  lVar1 = *p_Var16 + lVar3;
  lVar15 = *p_Var16 + -1000000 + lVar3;
  if (lVar1 < 1000000) {
    lVar15 = lVar1;
  }
  lVar14 = (ulong)(999999 < lVar1) + ((timeval *)(p_Var16 + -1))->tv_sec + lVar2;
  lVar1 = period->tv_sec;
  bVar19 = SBORROW8(lVar14,lVar1);
  lVar6 = lVar14 - lVar1;
  bVar18 = lVar14 == lVar1;
  if (bVar18) {
    lVar1 = period->tv_usec;
    bVar19 = SBORROW8(lVar15,lVar1);
    lVar6 = lVar15 - lVar1;
    bVar18 = lVar15 == lVar1;
  }
  if (!bVar18 && bVar19 == lVar6 < 0) {
    fprintf(_stderr,"CMinstall_pull_schedule(), avail region %d rejected, extends beyond period\n");
LAB_00120836:
    free(__dest);
    return -1;
  }
  bVar18 = SBORROW8(lVar2,lVar12);
  lVar1 = lVar2 - lVar12;
  if (lVar2 == lVar12) {
    bVar18 = SBORROW8(lVar3,lVar10);
    lVar1 = lVar3 - lVar10;
  }
  if (bVar18 != lVar1 < 0) {
    fwrite("CMinstall_pull_schedule(), avail regions overlap. Rejected\n",0x3b,1,_stderr);
    goto LAB_00120836;
  }
  sVar13 = sVar13 + 1;
  p_Var16 = p_Var16 + 4;
  lVar10 = lVar15;
  lVar12 = lVar14;
  goto LAB_00120527;
}

Assistant:

extern int
INT_CMinstall_pull_schedule(CManager cm, struct timeval *base_time, 
			    struct timeval *period, CMavail_period_ptr avail)
{
    int i = 0, count = 0;
    struct timeval zero = {0,0}, last_end = {0,0};
    CMavail_period_ptr sorted;
    while (timercmp(&avail[count].offset, &zero, !=) ||
	   timercmp(&avail[count].duration, &zero, !=)) {
	if (avail[count].offset.tv_sec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail sec offset is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].offset.tv_usec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail usec offset is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].duration.tv_sec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail sec duration is negative.  Rejected\n");
	    return 0;
	}
	if (avail[count].duration.tv_usec < 0) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail usec duration is negative.  Rejected\n");
	    return 0;
	}
	count++;
    }
    sorted = malloc(sizeof(avail[0]) * (count+1));
    memcpy(sorted, avail, sizeof(avail[0]) * count);
    qsort(sorted, count, sizeof(avail[0]), offset_compare);
    for (i = 0; i < count; i++) {
	struct timeval end;
	timeradd(&avail[i].offset, &avail[i].duration, &end);
	if (timercmp(&end, period, >)) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail region %d rejected, extends beyond period\n", i);
	    free(sorted);
	    return -1;
	}
	if (timercmp(&avail[i].offset, &last_end, <)) {
	    fprintf(stderr, "CMinstall_pull_schedule(), avail regions overlap. Rejected\n");
	    free(sorted);
	    return -1;
	}
	last_end = end;
    }

    cm->base_time = *base_time;
    cm->period = *period;
    cm->avail = sorted;
    transport_entry *trans_list;
    trans_list = cm->transports;
    CMtrace_out(cm, CMTransportVerbose, "CM installed pull schedule with period %ld secs, %zd usecs\n", period->tv_sec, (size_t) period->tv_usec);
    while ((trans_list != NULL) && (*trans_list != NULL)) {
	if ((*trans_list)->install_pull_schedule_func) {
	    (*trans_list)->install_pull_schedule_func(&CMstatic_trans_svcs,
						      *trans_list,
						      base_time, period,
						      cm->avail);
	    CMtrace_out(cm, CMTransportVerbose, "CM installed pull schedule to transport %s\n", (*trans_list)->trans_name);
	}
	trans_list++;
    }
    return 0;
}